

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_stream_parser.cc
# Opt level: O2

Status * __thiscall
google::protobuf::util::converter::JsonStreamParser::ParseEntry
          (Status *__return_storage_ptr__,JsonStreamParser *this,TokenType type)

{
  bool bVar1;
  StringPiece y;
  StringPiece y_00;
  StringPiece y_01;
  StringPiece local_78;
  StringPiece local_68;
  StringPiece local_58;
  undefined1 local_48 [8];
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  if (type == END_OBJECT) {
    (*this->ow_->_vptr_ObjectWriter[3])();
    Advance(this);
    this->recursion_depth_ = this->recursion_depth_ + -1;
    Status::Status(__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  if (type == UNKNOWN) {
    StringPiece::StringPiece(&local_78,"Expected an object key or }.");
    ReportUnknown(__return_storage_ptr__,this,local_78);
    return __return_storage_ptr__;
  }
  Status::Status(__return_storage_ptr__);
  if (type == BEGIN_KEY) {
    ParseKey((Status *)local_48,this);
    Status::operator=(__return_storage_ptr__,(Status *)local_48);
  }
  else {
    if (type == BEGIN_STRING) {
      ParseStringHelper((Status *)local_48,this);
      Status::operator=(__return_storage_ptr__,(Status *)local_48);
      std::__cxx11::string::~string((string *)&uStack_40);
      if (__return_storage_ptr__->error_code_ != OK) {
        return __return_storage_ptr__;
      }
      (this->key_storage_)._M_string_length = 0;
      *(this->key_storage_)._M_dataplus._M_p = '\0';
      if ((this->parsed_storage_)._M_string_length == 0) {
        local_48._0_4_ = *(undefined4 *)&(this->parsed_).ptr_;
        local_48._4_4_ = *(undefined4 *)((long)&(this->parsed_).ptr_ + 4);
        uStack_40 = (undefined4)(this->parsed_).length_;
        uStack_3c = *(undefined4 *)((long)&(this->parsed_).length_ + 4);
      }
      else {
        std::__cxx11::string::swap((string *)&this->parsed_storage_);
        StringPiece::StringPiece<std::allocator<char>>((StringPiece *)local_48,&this->key_storage_);
      }
      *(undefined4 *)&(this->key_).ptr_ = local_48._0_4_;
      *(undefined4 *)((long)&(this->key_).ptr_ + 4) = local_48._4_4_;
      *(undefined4 *)&(this->key_).length_ = uStack_40;
      *(undefined4 *)((long)&(this->key_).length_ + 4) = uStack_3c;
      (this->parsed_).ptr_ = (char *)0x0;
      (this->parsed_).length_ = 0;
      goto LAB_0032e121;
    }
    if (type - BEGIN_TRUE < 3) {
      ParseKey((Status *)local_48,this);
      Status::operator=(__return_storage_ptr__,(Status *)local_48);
      std::__cxx11::string::~string((string *)&uStack_40);
      if (__return_storage_ptr__->error_code_ != OK) {
        return __return_storage_ptr__;
      }
      y.length_ = DAT_003f2e10;
      y.ptr_ = kKeywordNull;
      bVar1 = operator==(this->key_,y);
      if (((!bVar1) &&
          (y_00.length_ = DAT_003f2df0, y_00.ptr_ = kKeywordTrue,
          bVar1 = operator==(this->key_,y_00), !bVar1)) &&
         (y_01.length_ = DAT_003f2e00, y_01.ptr_ = kKeywordFalse,
         bVar1 = operator==(this->key_,y_01), !bVar1)) goto LAB_0032e121;
      StringPiece::StringPiece(&local_68,"Expected an object key or }.");
      ReportFailure((Status *)local_48,this,local_68);
      Status::operator=(__return_storage_ptr__,(Status *)local_48);
    }
    else {
      StringPiece::StringPiece(&local_58,"Expected an object key or }.");
      ReportFailure((Status *)local_48,this,local_58);
      Status::operator=(__return_storage_ptr__,(Status *)local_48);
    }
  }
  std::__cxx11::string::~string((string *)&uStack_40);
LAB_0032e121:
  if (__return_storage_ptr__->error_code_ == OK) {
    local_48._0_4_ = OBJ_MID;
    std::
    deque<google::protobuf::util::converter::JsonStreamParser::ParseType,_std::allocator<google::protobuf::util::converter::JsonStreamParser::ParseType>_>
    ::emplace_back<google::protobuf::util::converter::JsonStreamParser::ParseType>
              (&(this->stack_).c,(ParseType *)local_48);
    local_48._0_4_ = ENTRY_MID;
    std::
    deque<google::protobuf::util::converter::JsonStreamParser::ParseType,_std::allocator<google::protobuf::util::converter::JsonStreamParser::ParseType>_>
    ::emplace_back<google::protobuf::util::converter::JsonStreamParser::ParseType>
              (&(this->stack_).c,(ParseType *)local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

util::Status JsonStreamParser::ParseEntry(TokenType type) {
  if (type == UNKNOWN) {
    return ReportUnknown("Expected an object key or }.");
  }

  // Close the object and return. This allows for trailing commas.
  if (type == END_OBJECT) {
    ow_->EndObject();
    Advance();
    --recursion_depth_;
    return util::Status();
  }

  util::Status result;
  if (type == BEGIN_STRING) {
    // Key is a string (standard JSON), parse it and store the string.
    result = ParseStringHelper();
    if (result.ok()) {
      key_storage_.clear();
      if (!parsed_storage_.empty()) {
        parsed_storage_.swap(key_storage_);
        key_ = StringPiece(key_storage_);
      } else {
        key_ = parsed_;
      }
      parsed_ = StringPiece();
    }
  } else if (type == BEGIN_KEY) {
    // Key is a bare key (back compat), create a StringPiece pointing to it.
    result = ParseKey();
  } else if (type == BEGIN_NULL || type == BEGIN_TRUE || type == BEGIN_FALSE) {
    // Key may be a bare key that begins with a reserved word.
    result = ParseKey();
    if (result.ok() && (key_ == kKeywordNull || key_ == kKeywordTrue ||
                        key_ == kKeywordFalse)) {
      result = ReportFailure("Expected an object key or }.");
    }
  } else {
    // Unknown key type, report an error.
    result = ReportFailure("Expected an object key or }.");
  }
  // On success we next expect an entry mid ':' then an object mid ',' or '}'
  if (result.ok()) {
    stack_.push(OBJ_MID);
    stack_.push(ENTRY_MID);
  }
  return result;
}